

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O2

int lws_callback_http(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  int iVar1;
  uchar *puVar2;
  lws_token_indexes token;
  uint uVar3;
  char buf [1024];
  
  if (reason == LWS_CALLBACK_HTTP) {
    token = WSI_TOKEN_GET_URI;
    while( true ) {
      puVar2 = lws_token_to_string(token);
      if (puVar2 == (uchar *)0x0) break;
      iVar1 = lws_hdr_total_length(wsi,token);
      if (iVar1 < 0x400 && iVar1 != 0) {
        iVar1 = lws_hdr_copy(wsi,buf,0x400,token);
        if (iVar1 < 0) {
          fprintf(_stderr,"    %s (too big)\n",puVar2);
        }
        else {
          buf[0x3ff] = '\0';
          fprintf(_stderr,"    %s = %s\n",puVar2,buf);
        }
      }
      token = token + WSI_TOKEN_POST_URI;
    }
    uVar3 = 1;
    while( true ) {
      iVar1 = lws_hdr_copy_fragment(wsi,buf,0x400,WSI_TOKEN_HTTP_URI_ARGS,uVar3 - 1);
      if (iVar1 < 1) break;
      _lws_log(4,"URI Arg %d: %s\n",(ulong)uVar3,buf);
      uVar3 = uVar3 + 1;
    }
    iVar1 = lws_return_http_status(wsi,0x194,(char *)0x0);
    if (iVar1 == 0) {
      iVar1 = lws_http_transaction_completed(wsi);
      iVar1 = -(uint)(iVar1 != 0);
    }
    else {
      iVar1 = -1;
    }
    return iVar1;
  }
  iVar1 = lws_callback_http_dummy(wsi,reason,user,in,len);
  return iVar1;
}

Assistant:

static int
lws_callback_http(struct lws *wsi, enum lws_callback_reasons reason, void *user,
		  void *in, size_t len)
{
	const unsigned char *c;
	char buf[1024];
	int n = 0, hlen;

	switch (reason) {
	case LWS_CALLBACK_HTTP:

		/* non-mount-handled accesses will turn up here */

		/* dump the headers */

		do {
			c = lws_token_to_string(n);
			if (!c) {
				n++;
				continue;
			}

			hlen = lws_hdr_total_length(wsi, n);
			if (!hlen || hlen > (int)sizeof(buf) - 1) {
				n++;
				continue;
			}

			if (lws_hdr_copy(wsi, buf, sizeof buf, n) < 0)
				fprintf(stderr, "    %s (too big)\n", (char *)c);
			else {
				buf[sizeof(buf) - 1] = '\0';

				fprintf(stderr, "    %s = %s\n", (char *)c, buf);
			}
			n++;
		} while (c);

		/* dump the individual URI Arg parameters */

		n = 0;
		while (lws_hdr_copy_fragment(wsi, buf, sizeof(buf),
					     WSI_TOKEN_HTTP_URI_ARGS, n) > 0) {
			lwsl_notice("URI Arg %d: %s\n", ++n, buf);
		}

		if (lws_return_http_status(wsi, HTTP_STATUS_NOT_FOUND, NULL))
			return -1;

		if (lws_http_transaction_completed(wsi))
			return -1;

		return 0;
	default:
		break;
	}

	return lws_callback_http_dummy(wsi, reason, user, in, len);
}